

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txoutproof.cpp
# Opt level: O3

void RegisterTxoutProofRPCCommands(CRPCTable *t)

{
  string category;
  string category_00;
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa0;
  long *local_50 [2];
  long local_40 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterTxoutProofRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterTxoutProofRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"blockchain","");
      category._M_string_length = in_stack_ffffffffffffff90;
      category._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff88;
      category.field_2._M_allocated_capacity = in_stack_ffffffffffffff98;
      category.field_2._8_8_ = in_stack_ffffffffffffffa0;
      CRPCCommand::CRPCCommand
                (RegisterTxoutProofRPCCommands::commands,category,(RpcMethodFnType)local_50);
      puVar3 = &stack0xffffffffffffffa0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffff90,"blockchain","");
      category_00._M_string_length = (size_type)puVar3;
      category_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff88;
      category_00.field_2._M_allocated_capacity = in_stack_ffffffffffffff98;
      category_00.field_2._8_8_ = in_stack_ffffffffffffffa0;
      CRPCCommand::CRPCCommand
                (RegisterTxoutProofRPCCommands::commands + 1,category_00,
                 (RpcMethodFnType)&stack0xffffffffffffff90);
      if (puVar3 != &stack0xffffffffffffffa0) {
        operator_delete(puVar3,in_stack_ffffffffffffffa0 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterTxoutProofRPCCommands(CRPCTable&)::commands);
    }
  }
  lVar2 = 0x100;
  pcmd = RegisterTxoutProofRPCCommands::commands;
  do {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
    lVar2 = lVar2 + -0x80;
  } while (lVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterTxoutProofRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"blockchain", &gettxoutproof},
        {"blockchain", &verifytxoutproof},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}